

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrMultisamplePixelBufferAccess.cpp
# Opt level: O3

MultisampleConstPixelBufferAccess *
rr::MultisampleConstPixelBufferAccess::fromSinglesampleAccess
          (MultisampleConstPixelBufferAccess *__return_storage_ptr__,
          ConstPixelBufferAccess *original)

{
  IVec3 local_50;
  IVec3 local_44;
  ConstPixelBufferAccess local_38;
  
  local_44.m_data[0] = 1;
  local_44.m_data._4_8_ = *(undefined8 *)(original->m_size).m_data;
  local_50.m_data._4_8_ = *(undefined8 *)(original->m_pitch).m_data;
  local_50.m_data[0] = local_50.m_data[1];
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (&local_38,&original->m_format,&local_44,&local_50,original->m_data);
  (__return_storage_ptr__->m_access).m_format = local_38.m_format;
  (__return_storage_ptr__->m_access).m_size.m_data[2] = local_38.m_size.m_data[2];
  *(undefined8 *)(__return_storage_ptr__->m_access).m_size.m_data = local_38.m_size.m_data._0_8_;
  *(undefined8 *)(__return_storage_ptr__->m_access).m_pitch.m_data = local_38.m_pitch.m_data._0_8_;
  (__return_storage_ptr__->m_access).m_pitch.m_data[2] = local_38.m_pitch.m_data[2];
  (__return_storage_ptr__->m_access).m_data = local_38.m_data;
  return __return_storage_ptr__;
}

Assistant:

MultisampleConstPixelBufferAccess MultisampleConstPixelBufferAccess::fromSinglesampleAccess (const tcu::ConstPixelBufferAccess& original)
{
	return MultisampleConstPixelBufferAccess(
				tcu::ConstPixelBufferAccess(
								original.getFormat(),
								tcu::IVec3(1, original.getWidth(), original.getHeight()),
								tcu::IVec3(original.getPixelPitch(), original.getPixelPitch(), original.getRowPitch()),
								original.getDataPtr()));
}